

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::sum(json_service *this,int x,int y)

{
  ostream *poVar1;
  runtime_error *this_00;
  int local_1b0 [8];
  ostringstream oss;
  
  if (y != 10) {
    local_1b0[0] = y + x;
    cppcms::json::value::value<int>((value *)&oss,local_1b0);
    cppcms::rpc::json_rpc_server::return_result((value *)this);
    cppcms::json::value::copyable::~copyable((copyable *)&oss);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x3d);
  std::operator<<(poVar1," y!=10");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(string *)local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sum(int x,int y)
	{
        TEST(y!=10);
		return_result(x+y);
	}